

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_mgau.c
# Opt level: O1

int32 ms_cont_mgau_frame_eval
                (ps_mgau_t *mg,int16 *senscr,uint8 *senone_active,int32 n_senone_active,
                mfcc_t **feat,int32 frame,int32 compallsen)

{
  int32 n_top;
  gauden_t *g;
  senone_t *s;
  short sVar1;
  int32 iVar2;
  ulong uVar3;
  int iVar4;
  int16 iVar5;
  int iVar6;
  uint id;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  n_top = *(int32 *)&mg[2].vt;
  g = (gauden_t *)mg[1].vt;
  s = *(senone_t **)&mg[1].frame_idx;
  if (compallsen == 0) {
    if (0 < g->n_mgau) {
      lVar8 = 0;
      do {
        *(undefined1 *)((long)&(mg[3].vt)->name + lVar8) = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < g->n_mgau);
    }
    uVar3 = (ulong)(uint)n_senone_active;
    if (0 < n_senone_active) {
      uVar7 = 0;
      uVar9 = 0;
      do {
        uVar9 = (ulong)((int)uVar9 + (uint)senone_active[uVar7]);
        *(undefined1 *)((long)&(mg[3].vt)->name + (ulong)s->mgau[uVar9]) = 1;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    if (0 < g->n_mgau) {
      lVar8 = 0;
      do {
        if (*(char *)((long)&(mg[3].vt)->name + lVar8) != '\0') {
          gauden_dist(g,(int)lVar8,n_top,feat,
                      *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + lVar8 * 8));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < g->n_mgau);
    }
    if (n_senone_active < 1) {
      iVar4 = 0x7fffffff;
    }
    else {
      uVar9 = 0;
      iVar4 = 0x7fffffff;
      uVar7 = 0;
      do {
        id = (int)uVar7 + (uint)senone_active[uVar9];
        uVar7 = (ulong)id;
        iVar2 = senone_eval(s,id,*(gauden_dist_t ***)
                                  (*(long *)&mg[2].frame_idx + (ulong)s->mgau[uVar7] * 8),n_top);
        sVar1 = (short)iVar2;
        iVar6 = (int)sVar1;
        if (iVar4 < sVar1) {
          iVar6 = iVar4;
        }
        iVar4 = iVar6;
        senscr[uVar7] = sVar1;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
    }
    if (0 < n_senone_active) {
      uVar7 = 0;
      uVar9 = 0;
      do {
        uVar9 = (ulong)((uint)senone_active[uVar7] + (int)uVar9);
        iVar6 = senscr[uVar9] - iVar4;
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        if (iVar6 < -0x7fff) {
          iVar6 = -0x8000;
        }
        senscr[uVar9] = (int16)iVar6;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
  }
  else {
    if (0 < g->n_mgau) {
      lVar8 = 0;
      do {
        gauden_dist(g,(int)lVar8,n_top,feat,
                    *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + lVar8 * 8));
        lVar8 = lVar8 + 1;
      } while (lVar8 < g->n_mgau);
    }
    uVar3 = (ulong)s->n_sen;
    iVar4 = 0x7fffffff;
    if (s->n_sen != 0) {
      uVar7 = 0;
      do {
        iVar2 = senone_eval(s,(int)uVar7,
                            *(gauden_dist_t ***)
                             (*(long *)&mg[2].frame_idx + (ulong)s->mgau[uVar7] * 8),n_top);
        sVar1 = (short)iVar2;
        iVar6 = (int)sVar1;
        if (iVar4 < sVar1) {
          iVar6 = iVar4;
        }
        iVar4 = iVar6;
        senscr[uVar7] = sVar1;
        uVar7 = uVar7 + 1;
        uVar3 = (ulong)s->n_sen;
      } while (uVar7 < uVar3);
    }
    if ((int)uVar3 != 0) {
      uVar7 = 0;
      do {
        iVar6 = senscr[uVar7] - iVar4;
        if (0x7ffe < iVar6) {
          iVar6 = 0x7fff;
        }
        iVar5 = (int16)iVar6;
        if (iVar6 < -0x7fff) {
          iVar5 = -0x8000;
        }
        senscr[uVar7] = iVar5;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
  }
  return 0;
}

Assistant:

int32
ms_cont_mgau_frame_eval(ps_mgau_t * mg,
			int16 *senscr,
			uint8 *senone_active,
			int32 n_senone_active,
                        mfcc_t ** feat,
			int32 frame,
			int32 compallsen)
{
    ms_mgau_model_t *msg = (ms_mgau_model_t *)mg;
    int32 gid;
    int32 topn;
    int32 best;
    gauden_t *g;
    senone_t *sen;

    (void)frame;
    topn = ms_mgau_topn(msg);
    g = ms_mgau_gauden(msg);
    sen = ms_mgau_senone(msg);

    if (compallsen) {
	int32 s;

	for (gid = 0; gid < g->n_mgau; gid++)
	    gauden_dist(g, gid, topn, feat, msg->dist[gid]);

	best = MAX_INT32;
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	}

	/* Normalize senone scores */
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	}
    }
    else {
	int32 i, n;
	/* Flag all active mixture-gaussian codebooks */
	for (gid = 0; gid < g->n_mgau; gid++)
	    msg->mgau_active[gid] = 0;

	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    /* senone_active consists of deltas. */
	    int32 s = senone_active[i] + n;
	    msg->mgau_active[sen->mgau[s]] = 1;
	    n = s;
	}

	/* Compute topn gaussian density values (for active codebooks) */
	for (gid = 0; gid < g->n_mgau; gid++) {
	    if (msg->mgau_active[gid])
		gauden_dist(g, gid, topn, feat, msg->dist[gid]);
	}

	best = MAX_INT32;
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	    n = s;
	}

	/* Normalize senone scores */
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	    n = s;
	}
    }

    return 0;
}